

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CupdlpWrapper.cpp
# Opt level: O3

void analysePdlpSolution(HighsOptions *options,HighsLp *lp,HighsSolution *highs_solution)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  vector<double,_std::allocator<double>_> *pvVar11;
  uint uVar12;
  char *pcVar13;
  vector<double,_std::allocator<double>_> *pvVar14;
  vector<double,_std::allocator<double>_> *pvVar15;
  vector<double,_std::allocator<double>_> *pvVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double local_98;
  undefined8 local_58;
  undefined8 uStack_50;
  
  uVar8 = (ulong)(uint)lp->num_col_;
  if (0 < lp->num_col_) {
    uVar17 = 0;
    do {
      printf("x[%2d] = %11.5g\n",
             (highs_solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start[uVar17],uVar17 & 0xffffffff);
      uVar17 = uVar17 + 1;
      uVar8 = (ulong)lp->num_col_;
    } while ((long)uVar17 < (long)uVar8);
  }
  uVar10 = lp->num_row_;
  if (0 < (int)uVar10) {
    uVar8 = 0;
    do {
      printf("y[%2d] = %11.5g\n",
             (highs_solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8],uVar8 & 0xffffffff);
      uVar8 = uVar8 + 1;
      uVar10 = lp->num_row_;
    } while ((long)uVar8 < (long)(int)uVar10);
    uVar8 = (ulong)(uint)lp->num_col_;
  }
  dVar20 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  dVar1 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  iVar7 = (int)uVar8;
  if (iVar7 < 1) {
    dVar24 = 0.0;
    dVar25 = 0.0;
    uVar18 = 0;
    uVar12 = 0;
    auVar26 = ZEXT816(0);
  }
  else {
    dVar24 = 0.0;
    dVar25 = 0.0;
    uVar17 = 0;
    uVar12 = 0;
    uVar18 = 0;
    auVar26 = ZEXT816(0);
    do {
      dVar2 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17];
      dVar3 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17];
      dVar4 = (highs_solution->col_value).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar17];
      if (dVar2 - dVar20 <= dVar4) {
        dVar21 = 0.0;
        if (dVar20 + dVar3 < dVar4) {
          dVar21 = dVar4 - dVar3;
        }
      }
      else {
        dVar21 = dVar2 - dVar4;
      }
      dVar22 = (highs_solution->col_dual).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar17] * (double)lp->sense_;
      dVar23 = ABS(dVar3 - dVar4);
      if (ABS(dVar2 - dVar4) <= ABS(dVar3 - dVar4)) {
        dVar23 = ABS(dVar2 - dVar4);
      }
      if (dVar23 <= dVar20) {
        dVar23 = 0.0;
        if (dVar2 < dVar3) {
          if (dVar4 < (dVar2 + dVar3) * 0.5) {
            dVar22 = -dVar22;
          }
          if (0.0 <= dVar22) {
            dVar23 = dVar22;
          }
        }
      }
      else {
        dVar23 = ABS(dVar22);
      }
      uVar18 = uVar18 + (dVar20 < dVar21);
      uVar12 = uVar12 + (dVar1 < dVar23);
      auVar5._8_8_ = dVar23;
      auVar5._0_8_ = dVar21;
      auVar26 = maxpd(auVar26,auVar5);
      dVar24 = dVar24 + dVar21;
      dVar25 = dVar25 + dVar23;
      uVar17 = uVar17 + 1;
    } while ((uVar8 & 0xffffffff) != uVar17);
  }
  if (0 < (int)uVar10) {
    uVar17 = 0;
    do {
      dVar2 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17];
      dVar3 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17];
      dVar4 = (highs_solution->row_value).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar17];
      if (dVar2 - dVar20 <= dVar4) {
        dVar21 = 0.0;
        if (dVar20 + dVar3 < dVar4) {
          dVar21 = dVar4 - dVar3;
        }
      }
      else {
        dVar21 = dVar2 - dVar4;
      }
      dVar22 = (highs_solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar17] * (double)lp->sense_;
      dVar23 = ABS(dVar3 - dVar4);
      if (ABS(dVar2 - dVar4) <= ABS(dVar3 - dVar4)) {
        dVar23 = ABS(dVar2 - dVar4);
      }
      if (dVar23 <= dVar20) {
        dVar23 = 0.0;
        if (dVar2 < dVar3) {
          if (dVar4 < (dVar2 + dVar3) * 0.5) {
            dVar22 = -dVar22;
          }
          if (0.0 <= dVar22) {
            dVar23 = dVar22;
          }
        }
      }
      else {
        dVar23 = ABS(dVar22);
      }
      uVar18 = uVar18 + (dVar20 < dVar21);
      uVar12 = uVar12 + (dVar1 < dVar23);
      auVar6._8_8_ = dVar23;
      auVar6._0_8_ = dVar21;
      auVar26 = maxpd(auVar26,auVar6);
      dVar24 = dVar24 + dVar21;
      dVar25 = dVar25 + dVar23;
      uVar17 = uVar17 + 1;
    } while (uVar10 != uVar17);
  }
  if (uVar10 + iVar7 == 0 || SCARRY4(uVar10,iVar7) != (int)(uVar10 + iVar7) < 0) {
    local_98 = 0.0;
  }
  else {
    local_98 = 0.0;
    uVar17 = 0;
    do {
      iVar7 = (int)uVar8;
      uVar8 = uVar17 & 0xffffffff;
      if ((long)uVar17 < (long)iVar7) {
        pcVar13 = "Column";
        uVar9 = uVar17;
        pvVar11 = &highs_solution->col_value;
        pvVar14 = &highs_solution->col_dual;
        pvVar15 = &lp->col_lower_;
        pvVar16 = &lp->col_upper_;
      }
      else {
        uVar8 = (ulong)(uint)((int)uVar17 - iVar7);
        uVar9 = (ulong)((int)uVar17 - iVar7);
        pcVar13 = "Row   ";
        pvVar11 = &highs_solution->row_value;
        pvVar14 = &highs_solution->row_dual;
        pvVar15 = &lp->row_lower_;
        pvVar16 = &lp->row_upper_;
      }
      dVar20 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar9];
      dVar1 = (pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      dVar2 = (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      uVar19 = -(ulong)(dVar20 < (dVar1 + dVar2) * 0.5);
      dVar20 = ABS((pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar9]) *
               ABS((double)(~uVar19 & (ulong)dVar2 | uVar19 & (ulong)dVar1) - dVar20);
      if (local_98 <= dVar20) {
        local_98 = dVar20;
      }
      printf("%s %2d [%11.5g, %11.5g, %11.5g] has (primal_residual, dual) values (%11.6g, %11.6g) so complementary_violation = %11.6g\n"
             ,pcVar13,uVar8);
      uVar17 = uVar17 + 1;
      uVar8 = (ulong)lp->num_col_;
    } while ((long)uVar17 < (long)((long)lp->num_row_ + uVar8));
  }
  printf("PDLP max complementary violation = %g\n",local_98);
  local_58 = auVar26._0_8_;
  printf("     primal infeasibilities (%d, %11.6g, %11.6g)\n",dVar24,local_58,(ulong)uVar18);
  uStack_50 = auVar26._8_8_;
  printf("     dual   infeasibilities (%d, %11.6g, %11.6g)\n",dVar25,uStack_50,(ulong)uVar12);
  return;
}

Assistant:

void analysePdlpSolution(const HighsOptions& options, const HighsLp& lp,
                         const HighsSolution& highs_solution) {
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    printf("x[%2d] = %11.5g\n", int(iCol), highs_solution.col_value[iCol]);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    printf("y[%2d] = %11.5g\n", int(iRow), highs_solution.row_dual[iRow]);
  }

  HighsInt num_primal_infeasibility = 0;
  HighsInt num_dual_infeasibility = 0;
  double max_primal_infeasibility = 0;
  double max_dual_infeasibility = 0;
  double sum_primal_infeasibility = 0;
  double sum_dual_infeasibility = 0;
  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  const double dual_feasibility_tolerance = options.dual_feasibility_tolerance;
  double lower;
  double upper;
  double value;
  double dual;
  // lambda for computing infeasibilities
  auto updateInfeasibilities = [&]() {
    double primal_infeasibility = 0;
    double dual_infeasibility = 0;
    // @primal_infeasibility calculation
    if (value < lower - primal_feasibility_tolerance) {
      // Below lower
      primal_infeasibility = lower - value;
    } else if (value > upper + primal_feasibility_tolerance) {
      // Above upper
      primal_infeasibility = value - upper;
    }
    double value_residual =
        std::min(std::fabs(lower - value), std::fabs(value - upper));
    bool at_a_bound = value_residual <= primal_feasibility_tolerance;
    if (at_a_bound) {
      // At a bound
      double middle = (lower + upper) * 0.5;
      if (lower < upper) {
        // Non-fixed variable
        if (value < middle) {
          // At lower
          dual_infeasibility = std::max(-dual, 0.);
        } else {
          // At upper
          dual_infeasibility = std::max(dual, 0.);
        }
      } else {
        // Fixed variable
        dual_infeasibility = 0;
      }
    } else {
      // Off bounds (or free)
      dual_infeasibility = fabs(dual);
    }
    // Accumulate primal infeasibilities
    if (primal_infeasibility > primal_feasibility_tolerance)
      num_primal_infeasibility++;
    max_primal_infeasibility =
        std::max(primal_infeasibility, max_primal_infeasibility);
    sum_primal_infeasibility += primal_infeasibility;
    // Accumulate dual infeasibilities
    if (dual_infeasibility > dual_feasibility_tolerance)
      num_dual_infeasibility++;
    max_dual_infeasibility =
        std::max(dual_infeasibility, max_dual_infeasibility);
    sum_dual_infeasibility += dual_infeasibility;
  };

  // Apply the model sense, as PDLP will have done this
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    lower = lp.col_lower_[iCol];
    upper = lp.col_upper_[iCol];
    value = highs_solution.col_value[iCol];
    dual = int(lp.sense_) * highs_solution.col_dual[iCol];
    updateInfeasibilities();
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    lower = lp.row_lower_[iRow];
    upper = lp.row_upper_[iRow];
    value = highs_solution.row_value[iRow];
    dual = int(lp.sense_) * highs_solution.row_dual[iRow];
    updateInfeasibilities();
  }
  //
  // Determine the sum of complementary violations
  double max_complementary_violation = 0;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    const bool is_col = iVar < lp.num_col_;
    const HighsInt iRow = iVar - lp.num_col_;
    const double primal = is_col ? highs_solution.col_value[iVar]
                                 : highs_solution.row_value[iRow];
    const double dual =
        is_col ? highs_solution.col_dual[iVar] : highs_solution.row_dual[iRow];
    const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
    const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
    const double mid = (lower + upper) * 0.5;
    const double primal_residual =
        primal < mid ? std::fabs(lower - primal) : std::fabs(upper - primal);
    const double dual_residual = std::fabs(dual);
    const double complementary_violation = primal_residual * dual_residual;
    max_complementary_violation =
        std::max(complementary_violation, max_complementary_violation);
    printf(
        "%s %2d [%11.5g, %11.5g, %11.5g] has (primal_residual, dual) values "
        "(%11.6g, %11.6g) so complementary_violation = %11.6g\n",
        is_col ? "Column" : "Row   ", is_col ? int(iVar) : int(iRow), lower,
        primal, upper, primal_residual, dual_residual, complementary_violation);
  }
  printf("PDLP max complementary violation = %g\n",
         max_complementary_violation);
  printf("     primal infeasibilities (%d, %11.6g, %11.6g)\n",
         int(num_primal_infeasibility), sum_primal_infeasibility,
         max_primal_infeasibility);
  printf("     dual   infeasibilities (%d, %11.6g, %11.6g)\n",
         int(num_dual_infeasibility), sum_dual_infeasibility,
         max_dual_infeasibility);
}